

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

uint32 gflags::ParseCommandLineFlagsInternal
                 (int *argc,char ***argv,bool remove_flags,bool do_report)

{
  uint uVar1;
  Mutex *pMVar2;
  char **__dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  int iVar4;
  char cVar5;
  size_type sVar6;
  bool bVar7;
  FlagRegistry *pFVar8;
  CommandLineFlag *pCVar9;
  char *pcVar10;
  size_t sVar11;
  mapped_type *pmVar12;
  undefined8 *puVar13;
  long *plVar14;
  _Base_ptr p_Var15;
  undefined7 in_register_00000009;
  long *plVar16;
  size_type *psVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar18;
  ulong *puVar19;
  undefined7 in_register_00000011;
  uint32 uVar20;
  char *pcVar21;
  uint uVar22;
  string key;
  string error_message;
  char *value;
  CommandLineFlagParser parser;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  string local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  undefined8 uStack_1c0;
  FlagRegistry *local_1b8;
  string local_1b0;
  key_type local_190;
  char *local_170;
  undefined4 local_168;
  undefined4 local_164;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  undefined4 *local_140;
  undefined8 local_138;
  undefined4 local_130;
  undefined3 uStack_12c;
  undefined1 local_129;
  char *local_120;
  CommandLineFlagParser local_118;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1b8 = (FlagRegistry *)argc;
  SetArgv(*argc,*argv);
  pFVar8 = anon_unknown_2::FlagRegistry::GlobalRegistry();
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar2 = &pFVar8->lock_;
  iVar4 = pMVar2->mutex_;
  pMVar2->mutex_ = pMVar2->mutex_ + -1;
  local_118.registry_ = pFVar8;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (iVar4 != 0) {
LAB_0013ecab:
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  anon_unknown_2::CommandLineFlagParser::ProcessFlagfileLocked
            (&local_50,&local_118,fLS::FLAGS_flagfile_abi_cxx11_,SET_FLAGS_VALUE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
            (&local_70,&local_118,fLS::FLAGS_fromenv_abi_cxx11_,SET_FLAGS_VALUE,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
            (&local_90,&local_118,fLS::FLAGS_tryfromenv_abi_cxx11_,SET_FLAGS_VALUE,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pMVar2 = &pFVar8->lock_;
  pMVar2->mutex_ = pMVar2->mutex_ + 1;
  if (pMVar2->mutex_ == 0) {
    uVar20 = *(uint32 *)&(local_1b8->flags_)._M_t._M_impl;
    pMVar2 = &(local_118.registry_)->lock_;
    iVar4 = pMVar2->mutex_;
    pMVar2->mutex_ = pMVar2->mutex_ + -1;
    if (iVar4 != 0) goto LAB_0013ecab;
    local_168 = (undefined4)CONCAT71(in_register_00000011,remove_flags);
    local_164 = (undefined4)CONCAT71(in_register_00000009,do_report);
    if (1 < (int)uVar20) {
      uVar22 = 1;
      do {
        pFVar8 = local_1b8;
        pcVar21 = (*argv)[(int)uVar22];
        if (*pcVar21 == '-') {
          if (pcVar21[1] == '-') {
            pcVar21 = pcVar21 + 2;
          }
          else {
            if (pcVar21[1] == '\0') goto LAB_0013e2b4;
            pcVar21 = pcVar21 + 1;
          }
          if (*pcVar21 == '\0') {
            uVar20 = uVar22 + 1;
            bVar7 = true;
          }
          else {
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            local_1f8._M_string_length = 0;
            local_1f8.field_2._M_allocated_capacity =
                 local_1f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            local_1b0._M_string_length = 0;
            local_1b0.field_2._M_allocated_capacity =
                 local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            pCVar9 = anon_unknown_2::FlagRegistry::SplitArgumentLocked
                               (local_118.registry_,pcVar21,&local_1f8,&local_170,&local_1b0);
            if (pCVar9 == (CommandLineFlag *)0x0) {
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&local_118.undefined_names_,&local_1f8);
              std::__cxx11::string::_M_replace
                        ((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x151530);
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&local_118.error_flags_,&local_1f8);
              bVar7 = false;
              std::__cxx11::string::_M_assign((string *)pmVar12);
            }
            else {
              if (local_170 == (char *)0x0) {
                cVar5 = pCVar9->defvalue_->type_;
                if (cVar5 == '\0') {
                  __assert_fail("flag->Type() != FlagValue::FV_BOOL",
                                "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                                ,0x42d,
                                "uint32 gflags::(anonymous namespace)::CommandLineFlagParser::ParseNewCommandLineFlags(int *, char ***, bool)"
                               );
                }
                uVar1 = uVar22 + 1;
                if ((int)uVar20 <= (int)uVar1) {
                  local_140 = &local_130;
                  uStack_12c = 0x203a52;
                  local_130 = 0x4f525245;
                  local_138 = 7;
                  local_129 = 0;
                  plVar14 = (long *)std::__cxx11::string::append((char *)&local_140);
                  local_160 = &local_150;
                  plVar16 = plVar14 + 2;
                  if ((long *)*plVar14 == plVar16) {
                    local_150 = *plVar16;
                    lStack_148 = plVar14[3];
                  }
                  else {
                    local_150 = *plVar16;
                    local_160 = (long *)*plVar14;
                  }
                  local_158 = plVar14[1];
                  *plVar14 = (long)plVar16;
                  plVar14[1] = 0;
                  *(undefined1 *)(plVar14 + 2) = 0;
                  plVar14 = (long *)std::__cxx11::string::append((char *)&local_160);
                  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                  psVar17 = (size_type *)(plVar14 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar14 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar17) {
                    local_190.field_2._M_allocated_capacity = *psVar17;
                    local_190.field_2._8_8_ = plVar14[3];
                  }
                  else {
                    local_190.field_2._M_allocated_capacity = *psVar17;
                    local_190._M_dataplus._M_p = (pointer)*plVar14;
                  }
                  local_190._M_string_length = plVar14[1];
                  *plVar14 = (long)psVar17;
                  plVar14[1] = 0;
                  *(undefined1 *)(plVar14 + 2) = 0;
                  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
                  local_1d8 = &local_1c8;
                  ppaVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              **)(puVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       **)*puVar13 == ppaVar18) {
                    local_1c8 = *ppaVar18;
                    uStack_1c0 = puVar13[3];
                  }
                  else {
                    local_1c8 = *ppaVar18;
                    local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 **)*puVar13;
                  }
                  local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)puVar13[1];
                  *puVar13 = ppaVar18;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  plVar14 = (long *)std::__cxx11::string::append((char *)&local_1d8);
                  local_218 = &local_208;
                  plVar16 = plVar14 + 2;
                  if ((long *)*plVar14 == plVar16) {
                    local_208 = *plVar16;
                    lStack_200 = plVar14[3];
                  }
                  else {
                    local_208 = *plVar16;
                    local_218 = (long *)*plVar14;
                  }
                  local_210 = plVar14[1];
                  *plVar14 = (long)plVar16;
                  plVar14[1] = 0;
                  *(undefined1 *)(plVar14 + 2) = 0;
                  pmVar12 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&local_118.error_flags_,&local_1f8);
                  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_218);
                  if (local_218 != &local_208) {
                    operator_delete(local_218);
                  }
                  if (local_1d8 != &local_1c8) {
                    operator_delete(local_1d8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                    operator_delete(local_190._M_dataplus._M_p);
                  }
                  if (local_160 != &local_150) {
                    operator_delete(local_160);
                  }
                  if (local_140 != &local_130) {
                    operator_delete(local_140);
                  }
                  if ((pCVar9->help_ != (char *)0x0) && ('\x01' < *pCVar9->help_)) {
                    local_1d8 = &local_1c8;
                    local_190._M_dataplus._M_p = (pointer)0x14;
                    local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 **)std::__cxx11::string::_M_create
                                              ((ulong *)&local_1d8,(ulong)&local_190);
                    local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_190._M_dataplus._M_p;
                    *local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)0x642067616c66203b;
                    local_1d8[1] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)0x6974706972637365;
                    *(undefined4 *)(local_1d8 + 2) = 0x203a6e6f;
                    local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_190._M_dataplus._M_p;
                    *(char *)((long)local_1d8 + (long)local_190._M_dataplus._M_p) = '\0';
                    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
                    local_218 = &local_208;
                    plVar14 = puVar13 + 2;
                    if ((long *)*puVar13 == plVar14) {
                      local_208 = *plVar14;
                      lStack_200 = puVar13[3];
                    }
                    else {
                      local_208 = *plVar14;
                      local_218 = (long *)*puVar13;
                    }
                    local_210 = puVar13[1];
                    *puVar13 = plVar14;
                    puVar13[1] = 0;
                    *(undefined1 *)(puVar13 + 2) = 0;
                    pmVar12 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[](&local_118.error_flags_,&local_1f8);
                    std::__cxx11::string::_M_append((char *)pmVar12,(ulong)local_218);
                    if (local_218 != &local_208) {
                      operator_delete(local_218);
                    }
                    if (local_1d8 != &local_1c8) {
                      operator_delete(local_1d8);
                    }
                  }
                  pmVar12 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&local_118.error_flags_,&local_1f8);
                  bVar7 = true;
                  std::__cxx11::string::append((char *)pmVar12);
                  goto LAB_0013e8cd;
                }
                local_170 = (*argv)[(int)uVar1];
                uVar22 = uVar1;
                if ((cVar5 == '\x06') && (*local_170 == '-')) {
                  pcVar21 = pCVar9->help_;
                  local_120 = local_170;
                  pcVar10 = strstr(pcVar21,"true");
                  if ((pcVar10 != (char *)0x0) ||
                     (pcVar21 = strstr(pcVar21,"false"), pcVar21 != (char *)0x0)) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Did you really mean to set flag \'",0x21);
                    pcVar21 = pCVar9->name_;
                    if (pcVar21 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1612d0);
                    }
                    else {
                      sVar11 = strlen(pcVar21);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,pcVar21,sVar11);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"\' to the value \'",0x10);
                    pcVar21 = local_120;
                    sVar11 = strlen(local_120);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pcVar21,sVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"\'?",2);
                  }
                }
              }
              (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                        (&local_b0,&local_118,pCVar9,local_170,SET_FLAGS_VALUE);
              bVar7 = false;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
            }
LAB_0013e8cd:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p);
            }
          }
        }
        else {
LAB_0013e2b4:
          __dest = *argv + (int)uVar22;
          memmove(__dest,__dest + 1,
                  (long)(int)(~uVar22 + *(int *)&(local_1b8->flags_)._M_t._M_impl) << 3);
          (*argv)[(long)*(int *)&(pFVar8->flags_)._M_t._M_impl + -1] = pcVar21;
          uVar20 = uVar20 - 1;
          uVar22 = uVar22 - 1;
          bVar7 = false;
        }
      } while ((!bVar7) && (uVar22 = uVar22 + 1, (int)uVar22 < (int)uVar20));
    }
    pMVar2 = &(local_118.registry_)->lock_;
    pMVar2->mutex_ = pMVar2->mutex_ + 1;
    if (pMVar2->mutex_ == 0) {
      if ((char)local_168 != '\0') {
        (*argv)[(long)(int)uVar20 + -1] = **argv;
        *argv = *argv + (long)(int)uVar20 + -1;
        *(uint32 *)&(local_1b8->flags_)._M_t._M_impl =
             (*(int *)&(local_1b8->flags_)._M_t._M_impl - uVar20) + 1;
        uVar20 = 1;
      }
      if ((char)local_164 != '\0') {
        HandleCommandLineHelpFlags();
      }
      pMVar2 = &(local_118.registry_)->lock_;
      iVar4 = pMVar2->mutex_;
      pMVar2->mutex_ = pMVar2->mutex_ + -1;
      if (iVar4 != 0) goto LAB_0013ecab;
      p_Var15 = ((local_118.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      local_1b8 = local_118.registry_;
      if ((_Rb_tree_header *)p_Var15 !=
          &((local_118.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header) {
        this = &local_118.error_flags_;
        do {
          pCVar9 = (CommandLineFlag *)p_Var15[1]._M_parent;
          if ((pCVar9->modified_ == false) &&
             (bVar7 = anon_unknown_2::CommandLineFlag::Validate(pCVar9,pCVar9->current_), !bVar7)) {
            std::__cxx11::string::string
                      ((string *)&local_1f8,*(char **)p_Var15[1]._M_parent,(allocator *)&local_1b0);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](this,&local_1f8);
            sVar6 = pmVar12->_M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p);
            }
            paVar3 = &local_1f8.field_2;
            if (sVar6 == 0) {
              local_1d8 = &local_1c8;
              local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x203a524f525245;
              local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x7;
              puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
              local_218 = &local_208;
              plVar14 = puVar13 + 2;
              if ((long *)*puVar13 == plVar14) {
                local_208 = *plVar14;
                lStack_200 = puVar13[3];
              }
              else {
                local_208 = *plVar14;
                local_218 = (long *)*puVar13;
              }
              local_210 = puVar13[1];
              *puVar13 = plVar14;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_218);
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              puVar19 = (ulong *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar19) {
                local_1b0.field_2._M_allocated_capacity = *puVar19;
                local_1b0.field_2._8_8_ = plVar14[3];
              }
              else {
                local_1b0.field_2._M_allocated_capacity = *puVar19;
                local_1b0._M_dataplus._M_p = (pointer)*plVar14;
              }
              local_1b0._M_string_length = plVar14[1];
              *plVar14 = (long)puVar19;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_1b0);
              puVar19 = (ulong *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar19) {
                local_1f8.field_2._M_allocated_capacity = *puVar19;
                local_1f8.field_2._8_8_ = plVar14[3];
                local_1f8._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_1f8.field_2._M_allocated_capacity = *puVar19;
                local_1f8._M_dataplus._M_p = (pointer)*plVar14;
              }
              local_1f8._M_string_length = plVar14[1];
              *plVar14 = (long)puVar19;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              std::__cxx11::string::string
                        ((string *)&local_190,*(char **)p_Var15[1]._M_parent,(allocator *)&local_160
                        );
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](this,&local_190);
              std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != paVar3) {
                operator_delete(local_1f8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p);
              }
              if (local_218 != &local_208) {
                operator_delete(local_218);
              }
              if (local_1d8 != &local_1c8) {
                operator_delete(local_1d8);
              }
              if (*(char *)&(p_Var15[1]._M_parent)->_M_right == '\0') {
                std::__cxx11::string::string
                          ((string *)&local_1f8,*(char **)p_Var15[1]._M_parent,
                           (allocator *)&local_1b0);
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](this,&local_1f8);
                std::__cxx11::string::append((char *)pmVar12);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != paVar3) {
                  operator_delete(local_1f8._M_dataplus._M_p);
                }
              }
              std::__cxx11::string::string
                        ((string *)&local_1f8,*(char **)p_Var15[1]._M_parent,(allocator *)&local_1b0
                        );
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](this,&local_1f8);
              std::__cxx11::string::append((char *)pmVar12);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != paVar3) {
                operator_delete(local_1f8._M_dataplus._M_p);
              }
            }
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 !=
                 &((local_118.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header);
      }
      pMVar2 = &local_1b8->lock_;
      pMVar2->mutex_ = pMVar2->mutex_ + 1;
      if (pMVar2->mutex_ == 0) {
        bVar7 = anon_unknown_2::CommandLineFlagParser::ReportErrors(&local_118);
        if (!bVar7) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_118.undefined_names_._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_118.error_flags_._M_t);
          return uVar20;
        }
        uVar20 = (*(code *)gflags_exitfunc)(1);
        return uVar20;
      }
    }
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
}

Assistant:

static uint32 ParseCommandLineFlagsInternal(int* argc, char*** argv,
                                            bool remove_flags, bool do_report) {
  SetArgv(*argc, const_cast<const char**>(*argv));    // save it for later

  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  CommandLineFlagParser parser(registry);

  // When we parse the commandline flags, we'll handle --flagfile,
  // --tryfromenv, etc. as we see them (since flag-evaluation order
  // may be important).  But sometimes apps set FLAGS_tryfromenv/etc.
  // manually before calling ParseCommandLineFlags.  We want to evaluate
  // those too, as if they were the first flags on the commandline.
  registry->Lock();
  parser.ProcessFlagfileLocked(FLAGS_flagfile, SET_FLAGS_VALUE);
  // Last arg here indicates whether flag-not-found is a fatal error or not
  parser.ProcessFromenvLocked(FLAGS_fromenv, SET_FLAGS_VALUE, true);
  parser.ProcessFromenvLocked(FLAGS_tryfromenv, SET_FLAGS_VALUE, false);
  registry->Unlock();

  // Now get the flags specified on the commandline
  const int r = parser.ParseNewCommandLineFlags(argc, argv, remove_flags);

  if (do_report)
    HandleCommandLineHelpFlags();   // may cause us to exit on --help, etc.

  // See if any of the unset flags fail their validation checks
  parser.ValidateUnmodifiedFlags();

  if (parser.ReportErrors())        // may cause us to exit on illegal flags
    gflags_exitfunc(1);
  return r;
}